

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::MergeLayerEdges
          (S2Builder *this,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,
          vector<int,_std::allocator<int>_> *edge_layers)

{
  long lVar1;
  pointer ppVar2;
  pointer pvVar3;
  ulong uVar4;
  long lVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  pointer ppVar6;
  ulong uVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> order;
  pair<int,_int> local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (layer_edges->
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = layer_input_edge_ids;
  for (uVar4 = 0;
      ppVar6 = order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
      ppVar2 = order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(layer_edges->
                             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18);
      uVar4 = uVar4 + 1) {
    for (uVar7 = 0;
        uVar7 < (ulong)((long)*(pointer *)
                               ((long)&pvVar3[uVar4].
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&pvVar3[uVar4].
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data >> 3); uVar7 = uVar7 + 1) {
      local_40.first = (int)uVar4;
      local_40.second = (int)uVar7;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&order,&local_40);
      pvVar3 = (layer_edges->
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar5 = (long)order.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)order.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar5 >> 3;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )order.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )order.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                )layer_edges);
    if (lVar5 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )ppVar2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                           )ppVar6,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                  )layer_edges);
    }
    else {
      __last._M_current = ppVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  )ppVar2,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                  )layer_edges);
      for (; __last._M_current != ppVar6; __last._M_current = __last._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                  (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                           )layer_edges);
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (edges,(long)order.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)order.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (input_edge_ids,
             (long)order.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)order.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (edge_layers,
             (long)order.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)order.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar2 = order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar2; ppVar6 = ppVar6 + 1) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (edges,(value_type *)
                     ((long)ppVar6->second * 8 +
                     *(long *)&(layer_edges->
                               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[ppVar6->first].
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data));
    std::vector<int,_std::allocator<int>_>::push_back
              (input_edge_ids,
               (value_type_conflict2 *)
               ((long)ppVar6->second * 4 +
               *(long *)&(local_38->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[ppVar6->first].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data));
    std::vector<int,_std::allocator<int>_>::push_back(edge_layers,&ppVar6->first);
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&order.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return;
}

Assistant:

void S2Builder::MergeLayerEdges(
    const vector<vector<Edge>>& layer_edges,
    const vector<vector<InputEdgeIdSetId>>& layer_input_edge_ids,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    vector<int>* edge_layers) const {
  vector<LayerEdgeId> order;
  for (int i = 0; i < layer_edges.size(); ++i) {
    for (int e = 0; e < layer_edges[i].size(); ++e) {
      order.push_back(LayerEdgeId(i, e));
    }
  }
  std::sort(order.begin(), order.end(),
    [&layer_edges](const LayerEdgeId& ai, const LayerEdgeId& bi) {
         return StableLessThan(layer_edges[ai.first][ai.second],
                               layer_edges[bi.first][bi.second], ai, bi);
            });
  edges->reserve(order.size());
  input_edge_ids->reserve(order.size());
  edge_layers->reserve(order.size());
  for (const LayerEdgeId& id : order) {
    edges->push_back(layer_edges[id.first][id.second]);
    input_edge_ids->push_back(layer_input_edge_ids[id.first][id.second]);
    edge_layers->push_back(id.first);
  }
}